

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  _xmlNode *p_Var4;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  pxVar1 = reader->node;
  if (pxVar1 == (xmlNodePtr)0x0) {
    return -1;
  }
  if (pxVar1->type != XML_ELEMENT_NODE) {
    return 0;
  }
  pxVar2 = reader->curnode;
  if (pxVar2 != (xmlNodePtr)0x0) {
    if (pxVar2->type == XML_ATTRIBUTE_NODE) {
      p_Var4 = pxVar2->next;
    }
    else {
      if (pxVar2->type != XML_NAMESPACE_DECL) {
        return 0;
      }
      if ((xmlNodePtr)pxVar2->_private != (xmlNodePtr)0x0) {
        reader->curnode = (xmlNodePtr)pxVar2->_private;
        return 1;
      }
      p_Var4 = (_xmlNode *)pxVar1->properties;
    }
    if (p_Var4 != (_xmlNode *)0x0) {
      reader->curnode = p_Var4;
      return 1;
    }
    return 0;
  }
  iVar3 = xmlTextReaderMoveToFirstAttribute(reader);
  return iVar3;
}

Assistant:

int
xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode == NULL)
	return(xmlTextReaderMoveToFirstAttribute(reader));

    if (reader->curnode->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) reader->curnode;
	if (ns->next != NULL) {
	    reader->curnode = (xmlNodePtr) ns->next;
	    return(1);
	}
	if (reader->node->properties != NULL) {
	    reader->curnode = (xmlNodePtr) reader->node->properties;
	    return(1);
	}
	return(0);
    } else if ((reader->curnode->type == XML_ATTRIBUTE_NODE) &&
	       (reader->curnode->next != NULL)) {
	reader->curnode = reader->curnode->next;
	return(1);
    }
    return(0);
}